

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::C_formatter<spdlog::details::null_scoped_padder>::format
          (C_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  long in_RDI;
  memory_buf_t *unaff_retaddr;
  int in_stack_0000000c;
  null_scoped_padder p;
  size_t field_size;
  null_scoped_padder local_29;
  undefined8 local_28;
  
  local_28 = 2;
  null_scoped_padder::null_scoped_padder(&local_29,2,(padding_info *)(in_RDI + 8),in_RCX);
  fmt_helper::pad2(in_stack_0000000c,unaff_retaddr);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }